

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O3

void clusterDDel(vector<DirectDelNode,_std::allocator<DirectDelNode>_> *nodes,
                vector<DirectDelCluster,_std::allocator<DirectDelCluster>_> *clusters)

{
  pointer pcVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  size_t __n;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  DirectDelNode n;
  DirectDelCluster dc;
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  size_t local_f0;
  char local_e8 [16];
  vector<DirectDelCluster,std::allocator<DirectDelCluster>> *local_d8;
  char *local_d0;
  ulong local_c8;
  pointer local_c0;
  pointer local_b8;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  char local_98 [16];
  undefined1 local_88 [16];
  DirectDelCluster local_70;
  
  local_b8 = (nodes->super__Vector_base<DirectDelNode,_std::allocator<DirectDelNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_c0 = (nodes->super__Vector_base<DirectDelNode,_std::allocator<DirectDelNode>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_d8 = (vector<DirectDelCluster,std::allocator<DirectDelCluster>> *)clusters;
  if (local_b8 != local_c0) {
    do {
      local_f8._M_p = local_e8;
      local_100._0_4_ = local_b8->pos;
      local_100._4_4_ = local_b8->delLen;
      pcVar1 = (local_b8->refName)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,pcVar1,pcVar1 + (local_b8->refName)._M_string_length);
      __n = local_f0;
      lVar2 = *(long *)local_d8;
      local_c8 = (long)*(pointer *)(local_d8 + 8) - lVar2 >> 6;
      local_d0 = local_f8._M_p;
      local_88._0_8_ = (double)(int)local_100._4_4_;
      local_88._8_8_ = 0;
      uVar4 = local_100._0_4_;
      iVar7 = local_100._4_4_ + local_100._0_4_;
      uVar10 = local_c8 & 0xffffffff;
      do {
        uVar10 = uVar10 - 1;
        if ((int)(uint)uVar10 < 0) {
LAB_00182e98:
          local_b0 = local_100;
          local_a8._M_p = local_98;
          std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_d0,local_d0 + __n);
          DirectDelCluster::DirectDelCluster(&local_70,(DirectDelNode *)local_b0);
          if (local_a8._M_p != local_98) {
            operator_delete(local_a8._M_p);
          }
          std::vector<DirectDelCluster,std::allocator<DirectDelCluster>>::
          emplace_back<DirectDelCluster&>(local_d8,&local_70);
          std::vector<DirectDelNode,_std::allocator<DirectDelNode>_>::~vector(&local_70.nodes);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70.info.refName._M_dataplus._M_p != &local_70.info.refName.field_2) {
            operator_delete(local_70.info.refName._M_dataplus._M_p);
          }
          goto LAB_00182f25;
        }
        uVar8 = (ulong)((uint)uVar10 & 0x7fffffff);
        if (local_c8 <= uVar8) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar8,local_c8);
        }
        if ((*(size_t *)(lVar2 + 0x10 + uVar8 * 0x40) != __n) ||
           ((piVar9 = (int *)(uVar8 * 0x40 + lVar2), __n != 0 &&
            (iVar5 = bcmp(*(void **)(piVar9 + 2),local_d0,__n), iVar5 != 0)))) goto LAB_00182e98;
        iVar5 = *piVar9;
        iVar6 = piVar9[1] + iVar5;
        if (iVar7 < iVar6) {
          iVar6 = iVar7;
        }
        if (iVar5 <= (int)uVar4) {
          iVar5 = uVar4;
        }
        auVar12._0_8_ = (double)(iVar6 - iVar5);
        auVar12._8_8_ = auVar12._0_8_;
        auVar13._8_4_ = local_88._0_4_;
        auVar13._0_8_ = (double)piVar9[1];
        auVar13._12_4_ = local_88._4_4_;
        auVar13 = divpd(auVar12,auVar13);
        lVar11 = -(ulong)(0.9 <= auVar13._8_8_);
        auVar3._8_4_ = (int)lVar11;
        auVar3._0_8_ = -(ulong)(0.9 <= auVar13._0_8_);
        auVar3._12_4_ = (int)((ulong)lVar11 >> 0x20);
        iVar5 = movmskpd(iVar5,auVar3);
      } while (iVar5 != 3);
      std::vector<DirectDelNode,std::allocator<DirectDelNode>>::emplace_back<DirectDelNode&>
                ((vector<DirectDelNode,std::allocator<DirectDelNode>> *)(piVar9 + 10),
                 (DirectDelNode *)local_100);
LAB_00182f25:
      if (local_f8._M_p != local_e8) {
        operator_delete(local_f8._M_p);
      }
      local_b8 = local_b8 + 1;
    } while (local_b8 != local_c0);
  }
  return;
}

Assistant:

void clusterDDel(const std::vector<DirectDelNode> &nodes, std::vector<DirectDelCluster> &clusters)
{
	for (DirectDelNode n : nodes)
	{
		bool found = false;
		for (int i = clusters.size() - 1; i >= 0; i--)
		{
			// diff chr
			if (clusters.at(i).info.refName != n.refName)
				break;
			if (checkRO(clusters.at(i).info, n))
			{
				// push new node
				clusters.at(i).nodes.emplace_back(n);
				found = true;
				break;
			}
		}
		// add new cluster
		if (!found)
		{
			DirectDelCluster dc(n);
			clusters.emplace_back(dc);
		}
	}
}